

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O2

void map_background(xchar x,xchar y,int show)

{
  uint bg;
  rm *prVar1;
  rm *loc_override;
  int iVar2;
  int iVar3;
  undefined7 in_register_00000031;
  undefined7 in_register_00000039;
  rm tmp_loc;
  rm local_30;
  
  iVar3 = (int)CONCAT71(in_register_00000039,x);
  iVar2 = (int)CONCAT71(in_register_00000031,y);
  bg = back_to_cmap(level,x,y);
  prVar1 = level->locations[iVar3] + iVar2;
  loc_override = prVar1;
  if (((level->flags).field_0x9 & 0x40) == 0) {
    loc_override = &local_30;
    local_30._8_4_ = *(undefined4 *)&level->locations[iVar3][iVar2].field_0x8;
    local_30._0_4_ = *(undefined4 *)&prVar1->field_0x0;
    local_30.typ = prVar1->typ;
    local_30.seenv = prVar1->seenv;
    local_30._6_2_ = *(undefined2 *)&prVar1->field_0x6;
  }
  *(uint *)loc_override = *(uint *)loc_override & 0xffffffc0 | bg & 0x3f;
  if (3 < bg - 0x19) {
    loc_override->field_0x6 = loc_override->field_0x6 & 0xfc;
  }
  if (show != 0) {
    dbuf_set(level,(int)x,(int)y,loc_override,bg,0,0,0,0,0,0,0,0,0);
  }
  return;
}

Assistant:

void map_background(xchar x, xchar y, int show)
{
    int cmap = back_to_cmap(level, x, y);
    struct rm *loc = &level->locations[x][y];
    struct rm tmp_loc;

    if (!level->flags.hero_memory) {
	tmp_loc = *loc;
	loc = &tmp_loc;
    }

    loc->mem_bg = cmap;
    if (cmap == S_vodoor || cmap == S_hodoor ||
	cmap == S_vcdoor || cmap == S_hcdoor) {
	/* leave memory alone, it'll be 0 if this wasn't
	 * remembered as a door */
    } else {
	loc->mem_door_l = 0;
	loc->mem_door_t = 0;
    }

    if (show)
	dbuf_set(level, x, y, loc, cmap, 0, 0, 0, 0, 0, 0, 0, 0, 0);
}